

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void * __thiscall
google::protobuf::Arena::AllocateAligned(Arena *this,type_info *allocated,size_t n)

{
  ThreadCache *pTVar1;
  void *pvVar2;
  Block *b_00;
  ulong n_00;
  Block *b;
  void *me;
  size_t n_local;
  type_info *allocated_local;
  Arena *this_local;
  
  n_00 = n + 7 & 0xfffffffffffffff8;
  if ((*(long *)(this + 0x38) != 0) && (*(long *)(this + 0x88) != 0)) {
    (**(code **)(this + 0x88))(allocated,n_00,*(undefined8 *)(this + 0x38));
  }
  pTVar1 = thread_cache();
  if ((pTVar1->last_lifecycle_id_seen == *(long *)this) &&
     (pTVar1 = thread_cache(), pTVar1->last_block_used_ != (Block *)0x0)) {
    pTVar1 = thread_cache();
    if (pTVar1->last_block_used_->size - pTVar1->last_block_used_->pos < n_00) {
      pvVar2 = SlowAlloc(this,n_00);
      return pvVar2;
    }
    pTVar1 = thread_cache();
    pvVar2 = AllocFromBlock(pTVar1->last_block_used_,n_00);
    return pvVar2;
  }
  pTVar1 = thread_cache();
  b_00 = (Block *)internal::Acquire_Load((Atomic64 *)(this + 0x10));
  if (((b_00 == (Block *)0x0) || ((ThreadCache *)b_00->owner != pTVar1)) ||
     (b_00->size - b_00->pos < n_00)) {
    this_local = (Arena *)SlowAlloc(this,n_00);
  }
  else {
    this_local = (Arena *)AllocFromBlock(b_00,n_00);
  }
  return this_local;
}

Assistant:

void* Arena::AllocateAligned(const std::type_info* allocated, size_t n) {
  // Align n to next multiple of 8 (from Hacker's Delight, Chapter 3.)
  n = (n + 7) & -8;

  // Monitor allocation if needed.
  if (GOOGLE_PREDICT_FALSE(hooks_cookie_ != NULL) &&
      options_.on_arena_allocation != NULL) {
    options_.on_arena_allocation(allocated, n, hooks_cookie_);
  }

  // If this thread already owns a block in this arena then try to use that.
  // This fast path optimizes the case where multiple threads allocate from the
  // same arena.
  if (thread_cache().last_lifecycle_id_seen == lifecycle_id_ &&
      thread_cache().last_block_used_ != NULL) {
    if (thread_cache().last_block_used_->avail() < n) {
      return SlowAlloc(n);
    }
    return AllocFromBlock(thread_cache().last_block_used_, n);
  }

  // Check whether we own the last accessed block on this arena.
  // This fast path optimizes the case where a single thread uses multiple
  // arenas.
  void* me = &thread_cache();
  Block* b = reinterpret_cast<Block*>(google::protobuf::internal::Acquire_Load(&hint_));
  if (!b || b->owner != me || b->avail() < n) {
    return SlowAlloc(n);
  }
  return AllocFromBlock(b, n);
}